

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SimpleMutexTest.cpp
# Opt level: O0

void __thiscall
TEST_SimpleMutexTest_CreateAndDestroy_Test::testBody
          (TEST_SimpleMutexTest_CreateAndDestroy_Test *this)

{
  UtestShell *pUVar1;
  char *pcVar2;
  char *pcVar3;
  TestTerminator *pTVar4;
  SimpleString local_a8;
  SimpleString local_98;
  SimpleString local_88;
  SimpleString local_78;
  SimpleString local_68;
  SimpleString local_58;
  SimpleString local_48 [2];
  SimpleString local_28;
  SimpleMutex local_18;
  SimpleMutex mtx;
  TEST_SimpleMutexTest_CreateAndDestroy_Test *this_local;
  
  mtx.psMtx = this;
  SimpleMutex::SimpleMutex(&local_18);
  SimpleMutex::~SimpleMutex(&local_18);
  if (mutexCreateCount == 1) {
    pUVar1 = UtestShell::getCurrent();
    pTVar4 = UtestShell::getCurrentTestTerminator();
    (*pUVar1->_vptr_UtestShell[0xe])
              (pUVar1,0,0,0,
               "/workspace/llm4binary/github/license_all_cmakelists_25/offa[P]cpputest/tests/CppUTest/SimpleMutexTest.cpp"
               ,0x56,pTVar4);
  }
  else {
    pUVar1 = UtestShell::getCurrent();
    StringFrom((int)&local_28);
    pcVar2 = SimpleString::asCharString(&local_28);
    StringFrom((int)local_48);
    pcVar3 = SimpleString::asCharString(local_48);
    pTVar4 = UtestShell::getCurrentTestTerminator();
    (*pUVar1->_vptr_UtestShell[0x16])
              (pUVar1,1,pcVar2,pcVar3,0,
               "/workspace/llm4binary/github/license_all_cmakelists_25/offa[P]cpputest/tests/CppUTest/SimpleMutexTest.cpp"
               ,0x56,pTVar4);
    SimpleString::~SimpleString(local_48);
    SimpleString::~SimpleString(&local_28);
  }
  if (mutexDestroyCount == 1) {
    pUVar1 = UtestShell::getCurrent();
    pTVar4 = UtestShell::getCurrentTestTerminator();
    (*pUVar1->_vptr_UtestShell[0xe])
              (pUVar1,0,0,0,
               "/workspace/llm4binary/github/license_all_cmakelists_25/offa[P]cpputest/tests/CppUTest/SimpleMutexTest.cpp"
               ,0x57,pTVar4);
  }
  else {
    pUVar1 = UtestShell::getCurrent();
    StringFrom((int)&local_58);
    pcVar2 = SimpleString::asCharString(&local_58);
    StringFrom((int)&local_68);
    pcVar3 = SimpleString::asCharString(&local_68);
    pTVar4 = UtestShell::getCurrentTestTerminator();
    (*pUVar1->_vptr_UtestShell[0x16])
              (pUVar1,1,pcVar2,pcVar3,0,
               "/workspace/llm4binary/github/license_all_cmakelists_25/offa[P]cpputest/tests/CppUTest/SimpleMutexTest.cpp"
               ,0x57,pTVar4);
    SimpleString::~SimpleString(&local_68);
    SimpleString::~SimpleString(&local_58);
  }
  if (mutexLockCount == 0) {
    pUVar1 = UtestShell::getCurrent();
    pTVar4 = UtestShell::getCurrentTestTerminator();
    (*pUVar1->_vptr_UtestShell[0xe])
              (pUVar1,0,0,0,
               "/workspace/llm4binary/github/license_all_cmakelists_25/offa[P]cpputest/tests/CppUTest/SimpleMutexTest.cpp"
               ,0x58,pTVar4);
  }
  else {
    pUVar1 = UtestShell::getCurrent();
    StringFrom((int)&local_78);
    pcVar2 = SimpleString::asCharString(&local_78);
    StringFrom((int)&local_88);
    pcVar3 = SimpleString::asCharString(&local_88);
    pTVar4 = UtestShell::getCurrentTestTerminator();
    (*pUVar1->_vptr_UtestShell[0x16])
              (pUVar1,1,pcVar2,pcVar3,0,
               "/workspace/llm4binary/github/license_all_cmakelists_25/offa[P]cpputest/tests/CppUTest/SimpleMutexTest.cpp"
               ,0x58,pTVar4);
    SimpleString::~SimpleString(&local_88);
    SimpleString::~SimpleString(&local_78);
  }
  if (mutexUnlockCount == 0) {
    pUVar1 = UtestShell::getCurrent();
    pTVar4 = UtestShell::getCurrentTestTerminator();
    (*pUVar1->_vptr_UtestShell[0xe])
              (pUVar1,0,0,0,
               "/workspace/llm4binary/github/license_all_cmakelists_25/offa[P]cpputest/tests/CppUTest/SimpleMutexTest.cpp"
               ,0x59,pTVar4);
  }
  else {
    pUVar1 = UtestShell::getCurrent();
    StringFrom((int)&local_98);
    pcVar2 = SimpleString::asCharString(&local_98);
    StringFrom((int)&local_a8);
    pcVar3 = SimpleString::asCharString(&local_a8);
    pTVar4 = UtestShell::getCurrentTestTerminator();
    (*pUVar1->_vptr_UtestShell[0x16])
              (pUVar1,1,pcVar2,pcVar3,0,
               "/workspace/llm4binary/github/license_all_cmakelists_25/offa[P]cpputest/tests/CppUTest/SimpleMutexTest.cpp"
               ,0x59,pTVar4);
    SimpleString::~SimpleString(&local_a8);
    SimpleString::~SimpleString(&local_98);
  }
  return;
}

Assistant:

TEST(SimpleMutexTest, CreateAndDestroy)
{
    {
        SimpleMutex mtx;
    }

    CHECK_EQUAL(1, mutexCreateCount);
    CHECK_EQUAL(1, mutexDestroyCount);
    CHECK_EQUAL(0, mutexLockCount);
    CHECK_EQUAL(0, mutexUnlockCount);
}